

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintUnate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fVerbose;
  uint fUseNaive;
  uint fUseBdds;
  char *pcVar3;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fUseNaive = 0;
  Extra_UtilGetoptReset();
  fUseBdds = 1;
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"bnvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x6e) {
      fUseNaive = fUseNaive ^ 1;
    }
    else {
      if (iVar1 != 0x62) {
        iVar1 = -2;
        Abc_Print(-2,"usage: print_unate [-bnvh]\n");
        Abc_Print(-2,"\t         computes unate variables of the PO functions\n");
        pcVar2 = "BDD";
        if (fUseBdds == 0) {
          pcVar2 = "SAT";
        }
        Abc_Print(-2,"\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n",
                  pcVar2);
        pcVar3 = "yes";
        pcVar2 = "yes";
        if (fUseNaive == 0) {
          pcVar2 = "no";
        }
        Abc_Print(-2,"\t-n     : toggle naive BDD-based computation [default = %s].\n",pcVar2);
        if (fVerbose == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-v     : enable verbose output [default = %s].\n",pcVar3);
        pcVar2 = "\t-h     : print the command usage\n";
LAB_001e826e:
        Abc_Print(iVar1,pcVar2);
        return 1;
      }
      fUseBdds = fUseBdds ^ 1;
    }
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar2 = "Empty network.\n";
  }
  else {
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      Abc_NtkPrintUnate(pNtk,fUseBdds,fUseNaive,fVerbose);
      return 0;
    }
    pcVar2 = "This command works only for AIGs (run \"strash\").\n";
  }
  iVar1 = -1;
  goto LAB_001e826e;
}

Assistant:

int Abc_CommandPrintUnate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseBdds;
    int fUseNaive;
    int fVerbose;
    extern void Abc_NtkPrintUnate( Abc_Ntk_t * pNtk, int fUseBdds, int fUseNaive, int fVerbose );

    // set defaults
    fUseBdds  = 1;
    fUseNaive = 0;
    fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fUseBdds ^= 1;
            break;
        case 'n':
            fUseNaive ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    Abc_NtkPrintUnate( pNtk, fUseBdds, fUseNaive, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: print_unate [-bnvh]\n" );
    Abc_Print( -2, "\t         computes unate variables of the PO functions\n" );
    Abc_Print( -2, "\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n", fUseBdds? "BDD": "SAT" );
    Abc_Print( -2, "\t-n     : toggle naive BDD-based computation [default = %s].\n", fUseNaive? "yes": "no" );
    Abc_Print( -2, "\t-v     : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}